

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string.cpp
# Opt level: O1

string * __thiscall
spvtools::to_string_abi_cxx11_(string *__return_storage_ptr__,spvtools *this,uint32_t n)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  char buf [10];
  char acStack_12 [9];
  undefined1 local_9;
  
  if ((int)this == 0) {
    local_9 = 0x30;
    uVar1 = 9;
  }
  else {
    lVar2 = 9;
    do {
      uVar1 = (uint)this;
      uVar3 = (ulong)this & 0xffffffff;
      this = (spvtools *)(uVar3 / 10);
      acStack_12[lVar2] =
           "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ_0123456789"
           [(ulong)(uVar1 + (int)(uVar3 / 10) * -10) + 0x35];
      lVar2 = lVar2 + -1;
    } while (9 < uVar1);
    uVar1 = (int)lVar2 + 1;
  }
  if (-1 < (int)uVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,acStack_12 + uVar1,
               acStack_12 + uVar1 + (int)(10 - uVar1));
    return __return_storage_ptr__;
  }
  __assert_fail("write_index >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/to_string.cpp"
                ,0x29,"std::string spvtools::to_string(uint32_t)");
}

Assistant:

std::string to_string(uint32_t n) {
  // This implementation avoids using standard library features that access
  // the locale.  Using the locale requires taking a mutex which causes
  // annoying serialization.

  constexpr int max_digits = 10;  // max uint has 10 digits
  // Contains the resulting digits, with least significant digit in the last
  // entry.
  char buf[max_digits];
  int write_index = max_digits - 1;
  if (n == 0) {
    buf[write_index] = '0';
  } else {
    while (n > 0) {
      int units = n % 10;
      buf[write_index--] = "0123456789"[units];
      n = (n - units) / 10;
    }
    write_index++;
  }
  assert(write_index >= 0);
  return std::string(buf + write_index, max_digits - write_index);
}